

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

uint128 * __thiscall
pstore::serialize::read<pstore::uint128,pstore::serialize::archive::database_reader>
          (uint128 *__return_storage_ptr__,serialize *this,database_reader *archive)

{
  type uninit_buffer;
  uint128 *local_28 [3];
  
  flood<pstore::serialize::details::aligned_storage<16ul,16ul>::type>((type *)local_28);
  serialize::archive::database_reader::get<pstore::uint128,void>
            ((database_reader *)__return_storage_ptr__,(uint128 *)local_28);
  return local_28[0];
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }